

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_aesgcmsiv.cc
# Opt level: O1

void anon_unknown.dwarf_f01a86::aead_aes_gcm_siv_kdf
               (int is_128_bit,aead_aes_gcm_siv_asm_ctx *gcm_siv_ctx,uint64_t *out_record_auth_key,
               uint64_t *out_record_enc_key,uint8_t *nonce)

{
  uint8_t padded_nonce [16];
  uint64_t key_material [12];
  undefined8 local_88;
  undefined4 local_80;
  uint64_t local_78 [2];
  uint64_t local_68;
  uint64_t local_58;
  uint64_t local_48;
  uint64_t local_38;
  uint64_t local_28;
  
  local_80 = *(undefined4 *)(nonce + 8);
  local_88 = *(undefined8 *)nonce;
  if (is_128_bit == 0) {
    aes256gcmsiv_kdf(&local_88,local_78,gcm_siv_ctx);
    *out_record_enc_key = local_58;
    out_record_enc_key[1] = local_48;
    out_record_enc_key[2] = local_38;
    out_record_enc_key[3] = local_28;
  }
  else {
    aes128gcmsiv_kdf(&local_88,local_78);
    *out_record_enc_key = local_58;
    out_record_enc_key[1] = local_48;
  }
  *out_record_auth_key = local_78[0];
  out_record_auth_key[1] = local_68;
  return;
}

Assistant:

void aead_aes_gcm_siv_kdf(int is_128_bit,
                          const struct aead_aes_gcm_siv_asm_ctx *gcm_siv_ctx,
                          uint64_t out_record_auth_key[2],
                          uint64_t out_record_enc_key[4],
                          const uint8_t nonce[12]) {
  alignas(16) uint8_t padded_nonce[16];
  OPENSSL_memcpy(padded_nonce, nonce, 12);

  alignas(16) uint64_t key_material[12];
  if (is_128_bit) {
    aes128gcmsiv_kdf(padded_nonce, key_material, &gcm_siv_ctx->key[0]);
    out_record_enc_key[0] = key_material[4];
    out_record_enc_key[1] = key_material[6];
  } else {
    aes256gcmsiv_kdf(padded_nonce, key_material, &gcm_siv_ctx->key[0]);
    out_record_enc_key[0] = key_material[4];
    out_record_enc_key[1] = key_material[6];
    out_record_enc_key[2] = key_material[8];
    out_record_enc_key[3] = key_material[10];
  }

  out_record_auth_key[0] = key_material[0];
  out_record_auth_key[1] = key_material[2];
}